

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnAtomicFenceExpr
          (BinaryReaderIR *this,uint32_t consistency_model)

{
  unique_ptr<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>_> local_30;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_28;
  uint32_t local_1c;
  BinaryReaderIR *pBStack_18;
  uint32_t consistency_model_local;
  BinaryReaderIR *this_local;
  
  local_1c = consistency_model;
  pBStack_18 = this;
  std::make_unique<wabt::AtomicFenceExpr,unsigned_int&>((uint *)&local_30);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::AtomicFenceExpr,std::default_delete<wabt::AtomicFenceExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_28,&local_30);
  this_local._4_4_ = AppendExpr(this,&local_28);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_28);
  std::unique_ptr<wabt::AtomicFenceExpr,_std::default_delete<wabt::AtomicFenceExpr>_>::~unique_ptr
            (&local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnAtomicFenceExpr(uint32_t consistency_model) {
  return AppendExpr(std::make_unique<AtomicFenceExpr>(consistency_model));
}